

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

size_t Imf_2_5::bytesPerDeepLineTable
                 (Header *header,int minY,int maxY,char *base,int xStride,int yStride,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  bool bVar1;
  int d;
  int d_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Box2i *pBVar6;
  Channel *pCVar7;
  int *piVar8;
  reference pvVar9;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  int y_1;
  size_t maxBytesPerLine;
  int x;
  int nBytes;
  int y;
  int sampleMaxX;
  int sampleMinX;
  int sampleMaxY;
  int sampleMinY;
  int pixelSize;
  int xSampling;
  int ySampling;
  ConstIterator c;
  ChannelList *channels;
  Box2i *dataWindow;
  ChannelList *in_stack_ffffffffffffff78;
  value_type vVar10;
  ConstIterator *in_stack_ffffffffffffff80;
  int local_74;
  value_type local_70;
  int local_68;
  int local_64;
  int local_60;
  
  pBVar6 = Header::dataWindow((Header *)0x7c513b);
  Header::channels((Header *)0x7c514d);
  ChannelList::begin(in_stack_ffffffffffffff78);
  while( true ) {
    ChannelList::end(in_stack_ffffffffffffff78);
    bVar1 = operator!=(in_stack_ffffffffffffff80,(ConstIterator *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x7c5192);
    d = pCVar7->ySampling;
    if (d < 1) {
      d = -d;
    }
    pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x7c51aa);
    d_00 = pCVar7->xSampling;
    if (d_00 < 1) {
      d_00 = -d_00;
    }
    ChannelList::ConstIterator::channel((ConstIterator *)0x7c51c2);
    iVar2 = pixelTypeSize((PixelType)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    local_60 = roundToNextMultiple(in_ESI,d);
    iVar3 = roundToPrevMultiple(in_EDX,d);
    iVar4 = roundToNextMultiple((pBVar6->min).x,d_00);
    iVar5 = roundToPrevMultiple((pBVar6->max).x,d_00);
    for (; local_60 <= iVar3; local_60 = d + local_60) {
      local_64 = 0;
      for (local_68 = iVar4; local_68 <= iVar5; local_68 = d_00 + local_68) {
        piVar8 = sampleCount(in_RCX,in_R8D,in_R9D,local_68,local_60);
        local_64 = iVar2 * *piVar8 + local_64;
      }
      in_stack_ffffffffffffff80 = (ConstIterator *)(long)local_64;
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000008,(long)(local_60 - (pBVar6->min).y));
      *pvVar9 = (long)&(in_stack_ffffffffffffff80->_i)._M_node + *pvVar9;
    }
    ChannelList::ConstIterator::operator++(in_stack_ffffffffffffff80);
  }
  local_70 = 0;
  for (local_74 = in_ESI; local_74 <= in_EDX; local_74 = local_74 + 1) {
    vVar10 = local_70;
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_00000008,(long)(local_74 - (pBVar6->min).y));
    if (vVar10 < *pvVar9) {
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000008,(long)(local_74 - (pBVar6->min).y));
      local_70 = *pvVar9;
    }
  }
  return local_70;
}

Assistant:

size_t
bytesPerDeepLineTable (const Header &header,
                       int minY, int maxY,
                       const char* base,
                       int xStride,
                       int yStride,
                       vector<size_t> &bytesPerLine)
{
    const Box2i &dataWindow = header.dataWindow();
    const ChannelList &channels = header.channels();

    for (ChannelList::ConstIterator c = channels.begin();
         c != channels.end();
         ++c)
    {
        const int ySampling = abs(c.channel().ySampling);
        const int xSampling = abs(c.channel().xSampling);
        const int pixelSize = pixelTypeSize (c.channel().type);

        // Here we transform from the domain over all pixels into the domain
        // of actual samples.  We want to sample points in [minY, maxY] where
        // (y % ySampling) == 0.  However, doing this by rejecting samples
        // requires O(height*width) modulo computations, which were a
        // significant bottleneck in the previous implementation of this
        // function.  For the low, low price of 4 divisions per channel, we
        // can tighten the y & x ranges to the least and greatest roots of the
        // sampling function and then stride by the sampling rate.
        const int sampleMinY = roundToNextMultiple(minY, ySampling);
        const int sampleMaxY = roundToPrevMultiple(maxY, ySampling);
        const int sampleMinX = roundToNextMultiple(dataWindow.min.x, xSampling);
        const int sampleMaxX = roundToPrevMultiple(dataWindow.max.x, xSampling);

        for (int y = sampleMinY; y <= sampleMaxY; y+=ySampling)
        {
            int nBytes = 0;
            for (int x = sampleMinX; x <= sampleMaxX; x += xSampling)
            {
                nBytes += pixelSize *
                          sampleCount(base, xStride, yStride, x, y);
            }
            bytesPerLine[y - dataWindow.min.y] += nBytes;
        }
    }

    size_t maxBytesPerLine = 0;

    for (int y = minY; y <= maxY; ++y)
        if (maxBytesPerLine < bytesPerLine[y - dataWindow.min.y])
            maxBytesPerLine = bytesPerLine[y - dataWindow.min.y];

    return maxBytesPerLine;
}